

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generator.h
# Opt level: O0

int __thiscall
cppqc::Generator<std::tuple<std::array<bool,_5UL>_>_>::
GenModel<cppqc::detail::TupleGenerator<std::array<bool,_5UL>_>_>::clone
          (GenModel<cppqc::detail::TupleGenerator<std::array<bool,_5UL>_>_> *this,__fn *__fn,
          void *__child_stack,int __flags,void *__arg,...)

{
  void *pvVar1;
  TupleGenerator<std::array<bool,_5UL>_> *in_stack_ffffffffffffffc8;
  TupleGenerator<std::array<bool,_5UL>_> *in_stack_ffffffffffffffe8;
  GenModel<cppqc::detail::TupleGenerator<std::array<bool,_5UL>_>_> *in_stack_fffffffffffffff0;
  
  pvVar1 = operator_new(0x10);
  detail::TupleGenerator<std::array<bool,_5UL>_>::TupleGenerator
            ((TupleGenerator<std::array<bool,_5UL>_> *)this,in_stack_ffffffffffffffc8);
  GenModel(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  detail::TupleGenerator<std::array<bool,_5UL>_>::~TupleGenerator
            ((TupleGenerator<std::array<bool,_5UL>_> *)0x13ce2c);
  return (int)pvVar1;
}

Assistant:

detail::GenConcept<T>* clone() const override {
      return new GenModel(m_obj);
    }